

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>,false>
               (tuple<long,_int,_int,_int> *begin,long end,int param_3,uint param_4)

{
  tuple<long,_int,_int,_int> *this;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  _Var4;
  ulong uVar5;
  long lVar6;
  tuple<long,_int,_int,_int> *ptVar7;
  pair<__gnu_cxx::__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>,_bool>
  pVar8;
  int local_64;
  
  this = (tuple<long,_int,_int,_int> *)(end + -0x18);
  local_64 = param_3;
  do {
    while( true ) {
      lVar6 = end - (long)begin;
      uVar2 = lVar6 / 0x18;
      if (lVar6 < 0x240) {
        if ((param_4 & 1) == 0) {
          unguarded_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                    (begin,end,lVar6 % 0x18);
          return;
        }
        insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  ();
        return;
      }
      uVar3 = uVar2 >> 1;
      ptVar7 = begin + uVar3;
      if (uVar2 < 0x81) {
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (ptVar7,begin,this);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (begin,ptVar7,this);
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (begin + 1,begin + (uVar3 - 1),(tuple<long,_int,_int,_int> *)(end + -0x30));
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (begin + 2,begin + uVar3 + 1,(tuple<long,_int,_int,_int> *)(end + -0x48));
        sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (begin + (uVar3 - 1),ptVar7,begin + uVar3 + 1);
        std::tuple<long,_int,_int,_int>::swap(begin,ptVar7);
      }
      if (((param_4 & 1) != 0) ||
         (bVar1 = std::
                  __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
                  ::__less(begin + -1,begin), bVar1)) break;
      _Var4 = partition_left<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                        (begin,end);
      begin = _Var4._M_current + 1;
    }
    pVar8 = partition_right<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                      (begin,end);
    _Var4 = pVar8.first._M_current;
    uVar3 = ((long)_Var4._M_current - (long)begin) / 0x18;
    ptVar7 = _Var4._M_current + 1;
    lVar6 = end - (long)ptVar7;
    uVar5 = lVar6 / 0x18;
    if (((long)uVar3 < (long)(uVar2 >> 3)) || ((long)uVar5 < (long)(uVar2 >> 3))) {
      local_64 = local_64 + -1;
      if (local_64 == 0) {
        std::
        make_heap<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (begin,end,lVar6 % 0x18);
        std::
        sort_heap<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                  (begin,end);
        return;
      }
      if (0x228 < (long)_Var4._M_current - (long)begin) {
        uVar2 = uVar3 >> 2;
        std::tuple<long,_int,_int,_int>::swap(begin,begin + uVar2);
        std::tuple<long,_int,_int,_int>::swap(_Var4._M_current + -1,_Var4._M_current + -uVar2);
        if (0x80 < uVar3) {
          std::tuple<long,_int,_int,_int>::swap(begin + 1,begin + uVar2 + 1);
          std::tuple<long,_int,_int,_int>::swap(begin + 2,begin + uVar2 + 2);
          std::tuple<long,_int,_int,_int>::swap(_Var4._M_current + -2,_Var4._M_current + ~uVar2);
          std::tuple<long,_int,_int,_int>::swap
                    (_Var4._M_current + -3,_Var4._M_current + (-2 - uVar2));
        }
      }
      if (0x228 < lVar6) {
        uVar2 = uVar5 >> 2;
        std::tuple<long,_int,_int,_int>::swap(ptVar7,_Var4._M_current + uVar2 + 1);
        std::tuple<long,_int,_int,_int>::swap
                  (this,(tuple<long,_int,_int,_int> *)(uVar2 * -0x18 + end));
        if (0x80 < uVar5) {
          std::tuple<long,_int,_int,_int>::swap(_Var4._M_current + 2,_Var4._M_current + uVar2 + 2);
          std::tuple<long,_int,_int,_int>::swap(_Var4._M_current + 3,_Var4._M_current + uVar2 + 3);
          std::tuple<long,_int,_int,_int>::swap
                    ((tuple<long,_int,_int,_int> *)(end + -0x30),
                     (tuple<long,_int,_int,_int> *)(~uVar2 * 0x18 + end));
          std::tuple<long,_int,_int,_int>::swap
                    ((tuple<long,_int,_int,_int> *)(end + -0x48),
                     (tuple<long,_int,_int,_int> *)((-2 - uVar2) * 0x18 + end));
        }
      }
    }
    else if (((((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
             (bVar1 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                                (begin,_Var4._M_current), bVar1)) &&
            (bVar1 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
                               (ptVar7,end), bVar1)) {
      return;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>,false>
              (begin,_Var4._M_current,local_64,param_4 & 1);
    param_4 = 0;
    begin = ptVar7;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }